

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_2fVector::Unitize(ON_2fVector *this)

{
  double dVar1;
  double dy;
  double dx;
  double d;
  bool rc;
  ON_2fVector *this_local;
  
  dVar1 = Length(this);
  if (0.0 < dVar1) {
    this->x = (float)((double)this->x / dVar1);
    this->y = (float)((double)this->y / dVar1);
  }
  return 0.0 < dVar1;
}

Assistant:

bool ON_2fVector::Unitize()
{
  bool rc = false;
  // Since x,y are floats, d will not be denormalized and the
  // ON_DBL_MIN tests in ON_2dVector::Unitize() are not needed.
  double d = Length();
  if ( d > 0.0 ) 
  {
    double dx = (double)x;
    double dy = (double)y;
    x = (float)(dx/d);
    y = (float)(dy/d);
    rc = true;
  }
  return rc;
}